

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptMap>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptMap> *this)

{
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  bool bVar1;
  void **ppvVar2;
  RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap> local_58;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> local_48;
  Var value;
  WriteBarrierPtr<void> local_30;
  Var key;
  Iterator iterator;
  JavascriptMap *data;
  RecyclableCollectionObjectWalker<Js::JavascriptMap> *this_local;
  
  iterator.current.ptr =
       (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)VarTo<Js::JavascriptMap>(this->instance);
  JavascriptMap::GetIterator((JavascriptMap *)&key);
  while( true ) {
    bVar1 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)&key);
    if (!bVar1) break;
    MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
    ::Iterator::Current((Iterator *)&key);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)&value
              );
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&value);
    local_30.ptr = *ppvVar2;
    MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
    ::Iterator::Current((Iterator *)&key);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
              (&local_48);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&local_48);
    local_48.value.ptr = *ppvVar2;
    this_00 = this->propertyList;
    RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>::
    RecyclableCollectionObjectWalkerPropertyData(&local_58,local_30.ptr,local_48.value.ptr);
    JsUtil::
    List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_00,&local_58);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptMap>::GetChildren()
    {
        JavascriptMap* data = VarTo<JavascriptMap>(instance);
        auto iterator = data->GetIterator();
        while (iterator.Next())
        {
            Var key = iterator.Current().Key();
            Var value = iterator.Current().Value();
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptMap>(key, value));
        }
    }